

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

TPZFlopCounter __thiscall TPZMatrix<TPZFlopCounter>::GetRandomVal(TPZMatrix<TPZFlopCounter> *this)

{
  int iVar1;
  TPZFlopCounter TVar2;
  TPZFlopCounter *oth;
  TPZFlopCounter in_stack_ffffffffffffffd8;
  double local_20;
  TPZFlopCounter local_18 [3];
  
  iVar1 = rand();
  local_20 = (double)iVar1;
  TPZFlopCounter::TPZFlopCounter(local_18,&local_20);
  oth = (TPZFlopCounter *)0x41dfffffffc00000;
  TPZFlopCounter::TPZFlopCounter
            ((TPZFlopCounter *)&stack0xffffffffffffffd8,(double *)&stack0xffffffffffffffd0);
  TVar2 = TPZFlopCounter::operator/(in_stack_ffffffffffffffd8.fVal,oth);
  return (TPZFlopCounter)TVar2.fVal;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}